

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TDeletingArray<FRandom_*,_FRandom_*>::~TDeletingArray(TDeletingArray<FRandom_*,_FRandom_*> *this)

{
  FRandom *pFVar1;
  FRandom *pFVar2;
  FRandom **ppFVar3;
  ulong uVar4;
  
  if ((this->super_TArray<FRandom_*,_FRandom_*>).Count != 0) {
    uVar4 = 0;
    do {
      pFVar1 = (this->super_TArray<FRandom_*,_FRandom_*>).Array[uVar4];
      if (pFVar1 != (FRandom *)0x0) {
        ppFVar3 = &FRandom::RNGList;
        do {
          pFVar2 = *ppFVar3;
          ppFVar3 = &pFVar2->Next;
          if (pFVar2 == (FRandom *)0x0) break;
        } while (pFVar2 != pFVar1);
        if (pFVar2 != (FRandom *)0x0) {
          FRandom::RNGList = *ppFVar3;
        }
        operator_delete(pFVar1,0x70);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (this->super_TArray<FRandom_*,_FRandom_*>).Count);
  }
  TArray<FRandom_*,_FRandom_*>::~TArray(&this->super_TArray<FRandom_*,_FRandom_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}